

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O0

void __thiscall
antlr::TokenStreamRecognitionException::~TokenStreamRecognitionException
          (TokenStreamRecognitionException *this)

{
  RecognitionException *in_RDI;
  
  (in_RDI->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamRecognitionException_004fdc80;
  RecognitionException::~RecognitionException(in_RDI);
  TokenStreamException::~TokenStreamException((TokenStreamException *)0x1c7c44);
  return;
}

Assistant:

virtual ~TokenStreamRecognitionException() throw()
	{
	}